

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution3d.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution3D::forward(Convolution3D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  size_t _elemsize;
  float *pfVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  int l;
  uint uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int z;
  int iVar21;
  long lVar22;
  int i;
  int iVar23;
  int iVar24;
  int _w;
  void *pvVar25;
  ulong uVar26;
  int iVar27;
  float fVar28;
  undefined1 auVar29 [12];
  float fVar30;
  int local_204;
  undefined1 local_1f8 [16];
  int local_1d8;
  void *local_1d0;
  int local_1a8;
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_bordered;
  Mat m;
  Mat local_c0;
  Option opt_pad;
  
  iVar3 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar15 = this->kernel_w;
  iVar27 = this->dilation_w;
  iVar11 = this->kernel_h;
  iVar16 = this->dilation_h;
  iVar4 = this->kernel_d;
  iVar17 = this->dilation_d;
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered._20_8_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  opt_pad.lightmode = opt->lightmode;
  opt_pad._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_pad.num_threads = opt->num_threads;
  opt_pad.blob_allocator = opt->blob_allocator;
  opt_pad.workspace_allocator = opt->workspace_allocator;
  opt_pad.openmp_blocktime = opt->openmp_blocktime;
  opt_pad.use_winograd_convolution = opt->use_winograd_convolution;
  opt_pad.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_pad.use_int8_inference = opt->use_int8_inference;
  opt_pad.use_vulkan_compute = opt->use_vulkan_compute;
  uVar26._0_1_ = opt->use_bf16_storage;
  uVar26._1_1_ = opt->use_fp16_packed;
  uVar26._2_1_ = opt->use_fp16_storage;
  uVar26._3_1_ = opt->use_fp16_arithmetic;
  uVar26._4_1_ = opt->use_int8_packed;
  uVar26._5_1_ = opt->use_int8_storage;
  uVar26._6_1_ = opt->use_int8_arithmetic;
  uVar26._7_1_ = opt->use_packing_layout;
  opt_pad.use_shader_pack8 = opt->use_shader_pack8;
  opt_pad.use_subgroup_basic = opt->use_subgroup_basic;
  opt_pad.use_subgroup_vote = opt->use_subgroup_vote;
  opt_pad.use_subgroup_ballot = opt->use_subgroup_ballot;
  opt_pad.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  opt_pad.use_image_storage = opt->use_image_storage;
  opt_pad.use_tensor_storage = opt->use_tensor_storage;
  opt_pad.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  opt_pad.flush_denormals = opt->flush_denormals;
  opt_pad.use_local_pool_allocator = opt->use_local_pool_allocator;
  opt_pad.use_reserved_1 = opt->use_reserved_1;
  opt_pad.use_reserved_2 = opt->use_reserved_2;
  opt_pad.use_reserved_3 = opt->use_reserved_3;
  opt_pad.use_reserved_4 = opt->use_reserved_4;
  opt_pad.use_reserved_5 = opt->use_reserved_5;
  opt_pad.use_reserved_6 = opt->use_reserved_6;
  opt_pad.use_reserved_7 = opt->use_reserved_7;
  opt_pad.use_reserved_8 = opt->use_reserved_8;
  opt_pad.use_reserved_9 = opt->use_reserved_9;
  opt_pad.use_reserved_10 = opt->use_reserved_10;
  opt_pad.use_reserved_11 = opt->use_reserved_11;
  opt_pad._32_8_ = uVar26 & 0xffffffffffffff;
  make_padding(this,bottom_blob,&bottom_blob_bordered,&opt_pad);
  iVar8 = bottom_blob_bordered.h;
  iVar7 = bottom_blob_bordered.w;
  local_1d8 = -100;
  if ((bottom_blob_bordered.data != (void *)0x0) &&
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep != 0)) {
    iVar24 = (~((iVar15 + -1) * iVar27) + bottom_blob_bordered.w) / this->stride_w;
    iVar6 = (~((iVar11 + -1) * iVar16) + bottom_blob_bordered.h) / this->stride_h;
    iVar4 = (~((iVar4 + -1) * iVar17) + bottom_blob_bordered.d) / this->stride_d;
    uVar10 = this->kernel_w * this->kernel_h * this->kernel_d;
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(long)(int)uVar10,(allocator_type *)&m);
    _w = iVar24 + 1;
    iVar15 = this->dilation_h;
    iVar27 = this->kernel_w;
    iVar11 = this->kernel_h;
    iVar19 = this->dilation_w * iVar27;
    iVar16 = this->dilation_d;
    iVar17 = iVar15 * iVar11;
    iVar18 = 0;
    iVar20 = 0;
    for (iVar21 = 0; iVar21 < this->kernel_d; iVar21 = iVar21 + 1) {
      for (iVar23 = 0; iVar23 < iVar11; iVar23 = iVar23 + 1) {
        for (lVar22 = 0; (int)lVar22 < iVar27; lVar22 = lVar22 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar18 + lVar22] = iVar20;
          iVar20 = iVar20 + this->dilation_w;
          iVar27 = this->kernel_w;
        }
        iVar18 = iVar18 + (int)lVar22;
        iVar20 = iVar20 + (iVar15 * iVar7 - iVar19);
        iVar11 = this->kernel_h;
      }
      iVar20 = iVar20 + (iVar8 * iVar16 - iVar17) * iVar7;
    }
    Mat::create(top_blob,_w,iVar6 + 1,iVar4 + 1,this->num_output,_elemsize,opt->blob_allocator);
    local_1d8 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      local_1d8 = 0;
      uVar26 = 0;
      if (0 < (int)uVar10) {
        uVar26 = (ulong)uVar10;
      }
      iVar15 = 0;
      if (0 < iVar3) {
        iVar15 = iVar3;
      }
      local_204 = 0;
      for (lVar22 = 0; lVar22 < this->num_output; lVar22 = lVar22 + 1) {
        Mat::channel(&m,top_blob,(int)lVar22);
        local_1d0 = m.data;
        Mat::~Mat(&m);
        for (iVar27 = 0; iVar27 <= iVar4; iVar27 = iVar27 + 1) {
          for (iVar11 = 0; iVar11 <= iVar6; iVar11 = iVar11 + 1) {
            for (lVar14 = 0; lVar14 <= iVar24; lVar14 = lVar14 + 1) {
              if (this->bias_term == 0) {
                auVar29 = ZEXT812(0);
              }
              else {
                auVar29._4_8_ = 0;
                auVar29._0_4_ = *(uint *)((long)(this->bias_data).data + lVar22 * 4);
              }
              local_1f8._12_4_ = 0;
              local_1f8._0_12_ = auVar29;
              pvVar25 = (void *)((long)(this->weight_data).data + (long)local_204 * 4);
              local_1a8 = (int)lVar14;
              for (iVar16 = 0; iVar16 != iVar15; iVar16 = iVar16 + 1) {
                Mat::channel(&m,&bottom_blob_bordered,iVar16);
                Mat::depth(&local_c0,&m,this->stride_d * iVar27);
                pvVar9 = local_c0.data;
                lVar12 = (long)local_c0.w * (long)iVar11 * (long)this->stride_h * local_c0.elemsize;
                iVar17 = this->stride_w;
                Mat::~Mat(&local_c0);
                for (uVar13 = 0; uVar26 != uVar13; uVar13 = uVar13 + 1) {
                  local_1f8._0_4_ =
                       (float)local_1f8._0_4_ +
                       *(float *)((long)pvVar25 + uVar13 * 4) *
                       *(float *)((long)pvVar9 +
                                 (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar13] * 4 +
                                 (long)iVar17 * (long)local_1a8 * 4 + lVar12);
                }
                Mat::~Mat(&m);
                pvVar25 = (void *)((long)pvVar25 + (long)(int)uVar10 * 4);
              }
              fVar28 = (float)local_1f8._0_4_;
              switch(this->activation_type) {
              case 1:
                if ((float)local_1f8._0_4_ <= 0.0) {
                  fVar28 = 0.0;
                }
                break;
              case 2:
                fVar28 = (float)(~-(uint)(0.0 < (float)local_1f8._0_4_) &
                                 *(this->activation_params).data |
                                -(uint)(0.0 < (float)local_1f8._0_4_) & 0x3f800000) *
                         (float)local_1f8._0_4_;
                break;
              case 3:
                pfVar5 = (float *)(this->activation_params).data;
                fVar28 = *pfVar5;
                if ((float)local_1f8._0_4_ <= fVar28) {
                  local_1f8._0_4_ = fVar28;
                }
                fVar1 = pfVar5[1];
                fVar28 = (float)local_1f8._0_4_;
                if (fVar1 <= (float)local_1f8._0_4_) {
                  fVar28 = fVar1;
                }
                break;
              case 4:
                fVar28 = expf(-(float)local_1f8._0_4_);
                fVar28 = 1.0 / (fVar28 + 1.0);
                break;
              case 5:
                fVar28 = expf((float)local_1f8._0_4_);
                fVar28 = logf(fVar28 + 1.0);
                fVar28 = tanhf(fVar28);
                fVar28 = fVar28 * (float)local_1f8._0_4_;
                break;
              case 6:
                pfVar5 = (float *)(this->activation_params).data;
                fVar1 = *pfVar5;
                fVar2 = pfVar5[1];
                fVar30 = -fVar2 / fVar1;
                fVar28 = 0.0;
                if ((fVar30 <= (float)local_1f8._0_4_) &&
                   (fVar28 = (float)local_1f8._0_4_, (float)local_1f8._0_4_ <= fVar30 + 1.0 / fVar1)
                   ) {
                  fVar28 = (fVar1 * (float)local_1f8._0_4_ + fVar2) * (float)local_1f8._0_4_;
                }
              }
              *(float *)((long)local_1d0 + lVar14 * 4) = fVar28;
            }
            local_1d0 = (void *)((long)local_1d0 + (long)_w * 4);
          }
        }
        local_204 = local_204 + iVar3 * uVar10;
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&bottom_blob_bordered);
  return local_1d8;
}

Assistant:

int Convolution3D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extend_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extend_h = dilation_h * (kernel_h - 1) + 1;
    const int kernel_extend_d = dilation_d * (kernel_d - 1) + 1;

    Mat bottom_blob_bordered;
    Option opt_pad = opt;
    opt_pad.use_packing_layout = false;
    make_padding(bottom_blob, bottom_blob_bordered, opt_pad);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    d = bottom_blob_bordered.d;

    int outw = (w - kernel_extend_w) / stride_w + 1;
    int outh = (h - kernel_extend_h) / stride_h + 1;
    int outd = (d - kernel_extend_d) / stride_d + 1;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = w * dilation_h - kernel_w * dilation_w;
        int gap1 = h * w * dilation_d - w * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    top_blob.create(outw, outh, outd, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int z = 0; z < outd; z++)
        {
            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                        sum = bias_data[p];

                    const float* kptr = (const float*)weight_data + maxk * channels * p;

                    for (int q = 0; q < channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const float* sptr = m.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                        for (int l = 0; l < maxk; l++)
                        {
                            float val = sptr[space_ofs[l]];

                            float wt = kptr[l];
                            sum += val * wt;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = activation_ss(sum, activation_type, activation_params);
                }

                outptr += outw;
            }
        }
    }

    return 0;
}